

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void HMAC_SHA256_Final_Y(uchar *digest,HMAC_SHA256_CTX_Y *ctx)

{
  uchar ihash [32];
  uchar auStack_38 [32];
  
  SHA256_Final_Y(auStack_38,&ctx->ictx);
  SHA256_Update_Y(&ctx->octx,auStack_38,0x20);
  SHA256_Final_Y(digest,&ctx->octx);
  return;
}

Assistant:

void
HMAC_SHA256_Final_Y(unsigned char digest[32], HMAC_SHA256_CTX_Y * ctx)
{
	unsigned char ihash[32];

	/* Finish the inner SHA256 operation. */
	SHA256_Final_Y(ihash, &ctx->ictx);

	/* Feed the inner hash to the outer SHA256 operation. */
	SHA256_Update_Y(&ctx->octx, ihash, 32);

	/* Finish the outer SHA256 operation. */
	SHA256_Final_Y(digest, &ctx->octx);

	/* Clean the stack. */
	memset(ihash, 0, 32);
}